

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

bool QtPrivate::q_points_into_range<QArrayDataPointer<QBenchmarkResult>,QBenchmarkResult_const*>
               (QBenchmarkResult **p,QArrayDataPointer<QBenchmarkResult> *c)

{
  undefined8 uVar1;
  bool bVar2;
  QBenchmarkResult *__last;
  QBenchmarkResult *__first;
  difference_type dVar3;
  undefined8 *in_RDI;
  
  uVar1 = *in_RDI;
  __last = std::data<QArrayDataPointer<QBenchmarkResult>>
                     ((QArrayDataPointer<QBenchmarkResult> *)0x11f6a5);
  __first = std::data<QArrayDataPointer<QBenchmarkResult>>
                      ((QArrayDataPointer<QBenchmarkResult> *)0x11f6b4);
  std::begin<QArrayDataPointer<QBenchmarkResult>>((QArrayDataPointer<QBenchmarkResult> *)0x11f6c3);
  std::end<QArrayDataPointer<QBenchmarkResult>>((QArrayDataPointer<QBenchmarkResult> *)0x11f6d4);
  dVar3 = std::distance<QBenchmarkResult_const*>(__first,__last);
  bVar2 = q_points_into_range<QBenchmarkResult,std::less<void>>(uVar1,__last,__first + dVar3);
  return bVar2;
}

Assistant:

static constexpr bool q_points_into_range(const T &p, const C &c) noexcept
{
    static_assert(std::is_same_v<decltype(std::data(c)), T>);

    // std::distance because QArrayDataPointer has a "qsizetype size"
    // member but no size() function
    return q_points_into_range(p, std::data(c),
                               std::data(c) + std::distance(std::begin(c), std::end(c)));
}